

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O0

void __thiscall LinkedList<Transaction_*>::insert(LinkedList<Transaction_*> *this,Transaction *data)

{
  Node<Transaction_*> *__s;
  Node<Transaction_*> *node;
  Transaction *data_local;
  LinkedList<Transaction_*> *this_local;
  
  __s = (Node<Transaction_*> *)operator_new(0x10);
  memset(__s,0,0x10);
  __s->data = data;
  __s->next = (Node<Transaction_*> *)0x0;
  if (this->head == (Node<Transaction_*> *)0x0) {
    this->head = __s;
    this->tail = __s;
  }
  else {
    this->tail->next = __s;
    this->tail = __s;
  }
  this->size = this->size + 1;
  return;
}

Assistant:

void LinkedList<T>::insert(T data)
{
    auto node = new Node<T>();
    node->data = data;
    node->next = nullptr;

    if(head != nullptr)
    {
        tail->next = node;
        tail = node;
    } else{
        head = node;
        tail = node;
    }
    size++;
}